

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xatlas.cpp
# Opt level: O3

void __thiscall xatlas::internal::segment::CostQueue::push(CostQueue *this,float cost,uint32_t face)

{
  Array<xatlas::internal::segment::CostQueue::Pair> *this_00;
  float *pfVar1;
  uint uVar2;
  uint8_t *puVar3;
  ulong uVar4;
  Pair p;
  float local_18;
  uint32_t local_14;
  
  _local_18 = CONCAT44(face,cost);
  this_00 = &this->m_pairs;
  uVar2 = (this->m_pairs).m_base.size;
  if (((ulong)uVar2 == 0) ||
     (puVar3 = (this_00->m_base).buffer, cost < *(float *)(puVar3 + (ulong)(uVar2 - 1) * 8))) {
    ArrayBase::push_back(&this_00->m_base,(uint8_t *)&local_18);
  }
  else {
    uVar4 = 0;
    do {
      pfVar1 = (float *)(puVar3 + uVar4 * 8);
      if (*pfVar1 <= cost && cost != *pfVar1) goto LAB_001afe51;
      uVar4 = uVar4 + 1;
    } while (uVar2 != uVar4);
    uVar4 = (ulong)uVar2;
LAB_001afe51:
    ArrayBase::insertAt(&this_00->m_base,(uint32_t)uVar4,(uint8_t *)&local_18);
    if (this->m_maxSize < (this->m_pairs).m_base.size) {
      ArrayBase::removeAt(&this_00->m_base,0);
    }
  }
  return;
}

Assistant:

void push(float cost, uint32_t face)
	{
		const Pair p = { cost, face };
		if (m_pairs.isEmpty() || cost < peekCost())
			m_pairs.push_back(p);
		else {
			uint32_t i = 0;
			const uint32_t count = m_pairs.size();
			for (; i < count; i++) {
				if (m_pairs[i].cost < cost)
					break;
			}
			m_pairs.insertAt(i, p);
			if (m_pairs.size() > m_maxSize)
				m_pairs.removeAt(0);
		}
	}